

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings)

{
  SchemaBindingsPair key_00;
  size_t sVar1;
  RawBrandedSchema *value;
  Scope *pSVar2;
  RawBrandedSchema *brand;
  RawBrandedSchema **local_48;
  RawBrandedSchema **existing;
  SchemaBindingsPair key;
  RawSchema *schema_local;
  Impl *this_local;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings_local;
  
  bindings_local.ptr = (Scope *)bindings.size_;
  this_local = (Impl *)bindings.ptr;
  key.scopeBindings = (Scope *)schema;
  sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::size
                    ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
  if (sVar1 == 0) {
    bindings_local.size_ = (size_t)(key.scopeBindings + 3);
  }
  else {
    existing = (RawBrandedSchema **)key.scopeBindings;
    key.schema = (RawSchema *)
                 kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::begin
                           ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
    brand = (RawBrandedSchema *)
            kj::
            HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::
            find<capnp::(anonymous_namespace)::SchemaBindingsPair&>
                      ((HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>
                        *)&this->brands,(SchemaBindingsPair *)&existing);
    local_48 = kj::_::readMaybe<capnp::_::RawBrandedSchema*>
                         ((Maybe<capnp::_::RawBrandedSchema_*&> *)&brand);
    if (local_48 == (RawBrandedSchema **)0x0) {
      value = kj::Arena::allocate<capnp::_::RawBrandedSchema>(&this->arena);
      memset(value,0,0x28);
      key_00.scopeBindings = (Scope *)key.schema;
      key_00.schema = (RawSchema *)existing;
      kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::
      insert(&this->brands,key_00,value);
      value->generic = (RawSchema *)key.scopeBindings;
      pSVar2 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::begin
                         ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
      value->scopes = pSVar2;
      sVar1 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::size
                        ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&this_local);
      value->scopeCount = (uint32_t)sVar1;
      value->lazyInitializer = &(this->brandedInitializer).super_Initializer;
      bindings_local.size_ = (size_t)value;
    }
    else {
      bindings_local.size_ = (size_t)*local_48;
    }
  }
  return (RawBrandedSchema *)bindings_local.size_;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, kj::ArrayPtr<const _::RawBrandedSchema::Scope> bindings) {
  // Note that even if `bindings` is empty, we never want to return defaultBrand here because
  // defaultBrand has special status. Normally, the lack of bindings means all parameters are
  // "unspecified", which means their bindings are unknown and should be treated as AnyPointer.
  // But defaultBrand represents a special case where all parameters are still parameters -- they
  // haven't been bound in the first place. defaultBrand is used to represent the unbranded generic
  // type, while a no-binding brand is equivalent to binding all parameters to AnyPointer.

  if (bindings.size() == 0) {
    return &schema->defaultBrand;
  }

  SchemaBindingsPair key { schema, bindings.begin() };
  KJ_IF_MAYBE(existing, brands.find(key)) {
    return *existing;
  } else {
    auto& brand = arena.allocate<_::RawBrandedSchema>();
    memset(&brand, 0, sizeof(brand));
    brands.insert(key, &brand);

    brand.generic = schema;
    brand.scopes = bindings.begin();
    brand.scopeCount = bindings.size();
    brand.lazyInitializer = &brandedInitializer;
    return &brand;
  }